

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

bool tinyusdz::detail::OverridePrimSpecRec
               (uint32_t depth,PrimSpec *dst,PrimSpec *src,string *warn,string *err)

{
  string *psVar1;
  pointer pPVar2;
  pointer pPVar3;
  __type _Var4;
  bool bVar5;
  ostream *poVar6;
  mapped_type *this;
  _Base_ptr p_Var7;
  long lVar8;
  pointer pPVar9;
  pointer pPVar10;
  PrimSpec *pPVar11;
  PrimSpec *src_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  const_iterator __begin2;
  pointer __x;
  long lVar13;
  PrimSpec *child;
  pointer pPVar14;
  ostringstream ss_e;
  
  if (depth < 0x8000001) {
    PrimMetas::update_from(&dst->_metas,&src->_metas,true);
    for (p_Var7 = (src->_props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(src->_props)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7)) {
      this = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::operator[](&dst->_props,(key_type *)(p_Var7 + 1));
      Property::operator=(this,(Property *)(p_Var7 + 2));
    }
    pPVar14 = (dst->_children).
              super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
              super__Vector_impl_data._M_start;
    pPVar2 = (dst->_children).
             super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while( true ) {
      __x = (src->_children).
            super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
            super__Vector_impl_data._M_start;
      pPVar3 = (src->_children).
               super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pPVar14 == pPVar2) break;
      psVar1 = &pPVar14->_name;
      lVar13 = 0;
      for (lVar8 = ((long)pPVar3 - (long)__x) / 0x568 >> 2;
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&(__x->_name)._M_dataplus._M_p + lVar13), 0 < lVar8; lVar8 = lVar8 + -1)
      {
        _Var4 = ::std::operator==(pbVar12,psVar1);
        if (_Var4) {
          src_00 = (PrimSpec *)((long)&__x->_specifier + lVar13);
          goto LAB_00176dc9;
        }
        _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&__x[1]._name._M_dataplus._M_p + lVar13),psVar1);
        if (_Var4) {
          src_00 = (PrimSpec *)((long)&__x[1]._specifier + lVar13);
          goto LAB_00176dc9;
        }
        _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&__x[2]._name._M_dataplus._M_p + lVar13),psVar1);
        if (_Var4) {
          src_00 = (PrimSpec *)((long)&__x[2]._specifier + lVar13);
          goto LAB_00176dc9;
        }
        _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&__x[3]._name._M_dataplus._M_p + lVar13),psVar1);
        if (_Var4) {
          src_00 = (PrimSpec *)((long)&__x[3]._specifier + lVar13);
          goto LAB_00176dc9;
        }
        lVar13 = lVar13 + 0x15a0;
      }
      lVar8 = (((long)pPVar3 - (long)__x) - lVar13) / 0x568;
      pPVar11 = (PrimSpec *)((long)&__x->_specifier + lVar13);
      if (lVar8 == 1) {
LAB_00176db5:
        _Var4 = ::std::operator==(&pPVar11->_name,psVar1);
        src_00 = pPVar11;
        if (!_Var4) {
          src_00 = pPVar3;
        }
      }
      else if (lVar8 == 3) {
        _Var4 = ::std::operator==(pbVar12,psVar1);
        src_00 = pPVar11;
        if (!_Var4) {
          pPVar11 = (PrimSpec *)((long)&__x[1]._specifier + lVar13);
          goto LAB_00176d9e;
        }
      }
      else {
        src_00 = pPVar3;
        if (lVar8 == 2) {
LAB_00176d9e:
          _Var4 = ::std::operator==(&pPVar11->_name,psVar1);
          src_00 = pPVar11;
          if (!_Var4) {
            pPVar11 = pPVar11 + 1;
            goto LAB_00176db5;
          }
        }
      }
LAB_00176dc9:
      if ((src_00 != (src->_children).
                     super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
                     _M_impl.super__Vector_impl_data._M_finish) &&
         (bVar5 = OverridePrimSpecRec(depth + 1,pPVar14,src_00,warn,err), !bVar5))
      goto LAB_00176c00;
      pPVar14 = pPVar14 + 1;
    }
    for (; __x != pPVar3; __x = __x + 1) {
      pPVar14 = (dst->_children).
                super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
                super__Vector_impl_data._M_start;
      pPVar2 = (dst->_children).
               super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
               super__Vector_impl_data._M_finish;
      psVar1 = &__x->_name;
      lVar13 = 0;
      for (lVar8 = ((long)pPVar2 - (long)pPVar14) / 0x568 >> 2;
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&(pPVar14->_name)._M_dataplus._M_p + lVar13), 0 < lVar8;
          lVar8 = lVar8 + -1) {
        _Var4 = ::std::operator==(pbVar12,psVar1);
        if (_Var4) {
          pPVar9 = (pointer)((long)&pPVar14->_specifier + lVar13);
          goto LAB_00176f11;
        }
        _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&pPVar14[1]._name._M_dataplus._M_p + lVar13),psVar1);
        if (_Var4) {
          pPVar9 = (pointer)((long)&pPVar14[1]._specifier + lVar13);
          goto LAB_00176f11;
        }
        _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&pPVar14[2]._name._M_dataplus._M_p + lVar13),psVar1);
        if (_Var4) {
          pPVar9 = (pointer)((long)&pPVar14[2]._specifier + lVar13);
          goto LAB_00176f11;
        }
        _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&pPVar14[3]._name._M_dataplus._M_p + lVar13),psVar1);
        if (_Var4) {
          pPVar9 = (pointer)((long)&pPVar14[3]._specifier + lVar13);
          goto LAB_00176f11;
        }
        lVar13 = lVar13 + 0x15a0;
      }
      lVar8 = (((long)pPVar2 - (long)pPVar14) - lVar13) / 0x568;
      pPVar10 = (pointer)((long)&pPVar14->_specifier + lVar13);
      if (lVar8 == 1) {
LAB_00176f6a:
        _Var4 = ::std::operator==(&pPVar10->_name,psVar1);
        pPVar9 = pPVar10;
        if (!_Var4) {
          pPVar9 = pPVar2;
        }
      }
      else if (lVar8 == 3) {
        _Var4 = ::std::operator==(pbVar12,psVar1);
        pPVar9 = pPVar10;
        if (!_Var4) {
          pPVar10 = (pointer)((long)&pPVar14[1]._specifier + lVar13);
          goto LAB_00176f4c;
        }
      }
      else {
        pPVar9 = pPVar2;
        if (lVar8 == 2) {
LAB_00176f4c:
          _Var4 = ::std::operator==(&pPVar10->_name,psVar1);
          pPVar9 = pPVar10;
          if (!_Var4) {
            pPVar10 = pPVar10 + 1;
            goto LAB_00176f6a;
          }
        }
      }
LAB_00176f11:
      if (pPVar9 == (dst->_children).
                    super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::push_back
                  (&dst->_children,__x);
      }
    }
    bVar5 = true;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar6 = ::std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar6 = ::std::operator<<(poVar6,":");
    poVar6 = ::std::operator<<(poVar6,"OverridePrimSpecRec");
    poVar6 = ::std::operator<<(poVar6,"():");
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x4b2);
    ::std::operator<<(poVar6," ");
    poVar6 = ::std::operator<<((ostream *)&ss_e,"PrimSpec tree too deep.");
    ::std::operator<<(poVar6,"\n");
    if (warn != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)warn);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
LAB_00176c00:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

static bool OverridePrimSpecRec(uint32_t depth, PrimSpec &dst,
                                const PrimSpec &src, std::string *warn,
                                std::string *err) {
  (void)warn;

  if (depth > (1024 * 1024 * 128)) {
    PUSH_ERROR_AND_RETURN("PrimSpec tree too deep.");
  }

  DCOUT("update_from");
  DCOUT(print_prim_metas(src.metas(), 1));
  // Override metadataum
  dst.metas().update_from(src.metas());
  DCOUT("update_from done");

  // Override properties
  for (const auto &prop : src.props()) {
    // replace
    dst.props()[prop.first] = prop.second;
  }

  // Override child primspecs.
  for (auto &child : dst.children()) {
    auto src_it = std::find_if(
        src.children().begin(), src.children().end(),
        [&child](const PrimSpec &ps) { return ps.name() == child.name(); });

    if (src_it != src.children().end()) {
      if (!OverridePrimSpecRec(depth + 1, child, (*src_it), warn, err)) {
        return false;
      }
    }
  }

  // Add child not exists in dst.
  for (auto &child : src.children()) {
    auto dst_it = std::find_if(
        dst.children().begin(), dst.children().end(),
        [&child](const PrimSpec &ps) { return ps.name() == child.name(); });

    if (dst_it == dst.children().end()) {
      dst.children().push_back(child);
    }
  }

  return true;
}